

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zip_set_archive_flag.c
# Opt level: O0

int zip_set_archive_flag(zip_t *za,zip_flags_t flag,int value)

{
  int iVar1;
  uint local_24;
  uint new_flags;
  int value_local;
  zip_flags_t flag_local;
  zip_t *za_local;
  
  if (flag == 4) {
    zip_error_set(&za->error,0x12,0);
    za_local._4_4_ = -1;
  }
  else {
    if (value == 0) {
      local_24 = za->ch_flags & (flag ^ 0xffffffff);
    }
    else {
      local_24 = za->ch_flags | flag;
    }
    if (local_24 == za->ch_flags) {
      za_local._4_4_ = 0;
    }
    else if ((za->flags & 2) == 0) {
      if (((((flag & 2) == 0) || (value == 0)) || ((za->ch_flags & 2) != 0)) ||
         (iVar1 = _zip_changed(za,(zip_uint64_t *)0x0), iVar1 == 0)) {
        za->ch_flags = local_24;
        za_local._4_4_ = 0;
      }
      else {
        zip_error_set(&za->error,0xf,0);
        za_local._4_4_ = -1;
      }
    }
    else {
      zip_error_set(&za->error,0x19,0);
      za_local._4_4_ = -1;
    }
  }
  return za_local._4_4_;
}

Assistant:

ZIP_EXTERN int
zip_set_archive_flag(zip_t *za, zip_flags_t flag, int value) {
    unsigned int new_flags;

    if (flag == ZIP_AFL_IS_TORRENTZIP) {
        zip_error_set(&za->error, ZIP_ER_INVAL, 0);
        return -1;
    }

    /* TODO: when setting ZIP_AFL_WANT_TORRENTZIP, we should error out if any changes have been made that are not allowed for torrentzip. */

    if (value) {
        new_flags = za->ch_flags | flag;
    }
    else {
        new_flags = za->ch_flags & ~flag;
    }

    if (new_flags == za->ch_flags) {
        return 0;
    }

    /* Allow removing ZIP_AFL_RDONLY if manually set, not if archive was opened read-only. */
    if (za->flags & ZIP_AFL_RDONLY) {
        zip_error_set(&za->error, ZIP_ER_RDONLY, 0);
        return -1;
    }

    if ((flag & ZIP_AFL_RDONLY) && value && (za->ch_flags & ZIP_AFL_RDONLY) == 0) {
        if (_zip_changed(za, NULL)) {
            zip_error_set(&za->error, ZIP_ER_CHANGED, 0);
            return -1;
        }
    }

    za->ch_flags = new_flags;

    return 0;
}